

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_mon_gen(parser *p)

{
  undefined2 uVar1;
  wchar_t wVar2;
  int iVar3;
  void *pvVar4;
  char *__s1;
  wchar_t value;
  char *label;
  angband_constants *z;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar2 = parser_getint(p,"value");
  if (wVar2 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar3 = strcmp(__s1,"chance");
    uVar1 = (undefined2)wVar2;
    if (iVar3 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x30) = uVar1;
    }
    else {
      iVar3 = strcmp(__s1,"level-min");
      if (iVar3 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x32) = uVar1;
      }
      else {
        iVar3 = strcmp(__s1,"town-day");
        if (iVar3 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x34) = uVar1;
        }
        else {
          iVar3 = strcmp(__s1,"town-night");
          if (iVar3 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x36) = uVar1;
          }
          else {
            iVar3 = strcmp(__s1,"repro-max");
            if (iVar3 == 0) {
              *(undefined2 *)((long)pvVar4 + 0x38) = uVar1;
            }
            else {
              iVar3 = strcmp(__s1,"ood-chance");
              if (iVar3 == 0) {
                *(undefined2 *)((long)pvVar4 + 0x3a) = uVar1;
              }
              else {
                iVar3 = strcmp(__s1,"ood-amount");
                if (iVar3 == 0) {
                  *(undefined2 *)((long)pvVar4 + 0x3c) = uVar1;
                }
                else {
                  iVar3 = strcmp(__s1,"group-max");
                  if (iVar3 == 0) {
                    *(undefined2 *)((long)pvVar4 + 0x3e) = uVar1;
                  }
                  else {
                    iVar3 = strcmp(__s1,"group-dist");
                    if (iVar3 != 0) {
                      return PARSE_ERROR_UNDEFINED_DIRECTIVE;
                    }
                    *(undefined2 *)((long)pvVar4 + 0x40) = uVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_mon_gen(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "chance"))
		z->alloc_monster_chance = value;
	else if (streq(label, "level-min"))
		z->level_monster_min = value;
	else if (streq(label, "town-day"))
		z->town_monsters_day = value;
	else if (streq(label, "town-night"))
		z->town_monsters_night = value;
	else if (streq(label, "repro-max"))
		z->repro_monster_max = value;
	else if (streq(label, "ood-chance"))
		z->ood_monster_chance = value;
	else if (streq(label, "ood-amount"))
		z->ood_monster_amount = value;
	else if (streq(label, "group-max"))
		z->monster_group_max = value;
	else if (streq(label, "group-dist"))
		z->monster_group_dist = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}